

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 ExprMakeTree(jx9_gen_state *pGen,jx9_expr_node **apNode,sxi32 nToken)

{
  jx9_expr_op **ppjVar1;
  sxi32 sVar2;
  uint uVar3;
  jx9_expr_node *pjVar4;
  ulong uVar5;
  SyToken *pSVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  sxu32 sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __n;
  jx9_expr_node *pjVar16;
  jx9_expr_op *pjVar17;
  ulong uVar18;
  jx9_expr_node *pjVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  jx9_expr_node **ppjVar24;
  bool bVar25;
  
  if (nToken < 1) {
    return 0;
  }
  uVar14 = (ulong)(uint)nToken;
  if ((nToken == 1) && ((*apNode)->xCode != (ProcNodeConstruct)0x0)) {
    return 0;
  }
  iVar20 = 0;
  do {
    pjVar16 = apNode[iVar20];
    if ((pjVar16 != (jx9_expr_node *)0x0) && (pjVar16->pStart->nType == 0x200)) {
      uVar7 = iVar20 + 1;
      uVar5 = (ulong)uVar7;
      if ((int)uVar7 < nToken) {
        iVar10 = 1;
        uVar21 = (long)(int)uVar7;
        do {
          if (apNode[uVar21] != (jx9_expr_node *)0x0) {
            uVar23 = apNode[uVar21]->pStart->nType;
            if ((uVar23 >> 10 & 1) == 0) {
              iVar10 = iVar10 + (uint)((uVar23 >> 9 & 1) != 0);
            }
            else {
              uVar5 = uVar21;
              if (iVar10 < 2) break;
              iVar10 = iVar10 + -1;
            }
          }
          uVar21 = uVar21 + 1;
          uVar5 = uVar14;
        } while (uVar14 != uVar21);
      }
      iVar10 = (int)uVar5;
      if (1 < iVar10 - iVar20) {
        sVar2 = ExprMakeTree(pGen,apNode + (int)uVar7,(iVar10 - iVar20) + -1);
        if (sVar2 != 0) {
          return sVar2;
        }
        pjVar16 = apNode[iVar20];
      }
      ExprFreeTree(pGen,pjVar16);
      ExprFreeTree(pGen,apNode[iVar10]);
      apNode[iVar20] = (jx9_expr_node *)0x0;
      apNode[iVar10] = (jx9_expr_node *)0x0;
      iVar20 = iVar10;
    }
    iVar20 = iVar20 + 1;
  } while (iVar20 < nToken);
  uVar21 = 0xffffffff;
  uVar15 = 1;
  uVar22 = 0;
  uVar5 = uVar14;
  ppjVar24 = apNode;
LAB_00128667:
  pjVar16 = apNode[uVar22];
  if (pjVar16 == (jx9_expr_node *)0x0) goto LAB_00128689;
  pjVar17 = pjVar16->pOp;
  if (((pjVar17 == (jx9_expr_op *)0x0) || (pjVar17->iPrec != 2)) ||
     (pjVar16->pLeft != (jx9_expr_node *)0x0)) {
LAB_00128686:
    uVar21 = uVar22 & 0xffffffff;
    goto LAB_00128689;
  }
  iVar20 = (int)uVar21;
  if (pjVar17->iOp == 2) {
    if ((-1 < iVar20) &&
       ((pjVar4 = apNode[uVar21], pjVar4->xCode == jx9CompileVariable ||
        ((pjVar4->pOp != (jx9_expr_op *)0x0 && (pjVar4->pOp->iPrec == 2)))))) {
      uVar18 = uVar22 + 1;
      uVar7 = (uint)uVar18;
      if (uVar18 < uVar14) {
        iVar20 = 1;
        uVar12 = uVar15;
        do {
          if (apNode[uVar12] != (jx9_expr_node *)0x0) {
            uVar7 = apNode[uVar12]->pStart->nType;
            if ((uVar7 >> 0xb & 1) == 0) {
              if ((uVar7 >> 0xc & 1) != 0) {
                uVar13 = uVar12;
                if (iVar20 < 2) break;
                iVar20 = iVar20 + -1;
              }
            }
            else {
              iVar20 = iVar20 + 1;
            }
          }
          uVar12 = uVar12 + 1;
          uVar13 = uVar14;
        } while (uVar14 != uVar12);
        uVar7 = (uint)uVar13;
      }
      if (uVar18 < uVar7) {
        sVar2 = ExprMakeTree(pGen,apNode + uVar18,~(uint)uVar22 + uVar7);
        if (sVar2 != 0) {
          return sVar2;
        }
        SySetPut(&pjVar16->aNodeArgs,apNode + uVar18);
        pjVar4 = apNode[uVar21];
      }
      pjVar16->pLeft = pjVar4;
      pjVar16->pRight = (jx9_expr_node *)0x0;
      apNode[uVar21] = (jx9_expr_node *)0x0;
      if (uVar22 < uVar7) {
        memset(apNode + uVar22 + 1,0,(ulong)(uVar7 + ~(uint)uVar22) * 8 + 8);
      }
      uVar21 = uVar22 & 0xffffffff;
      goto LAB_00128689;
    }
    goto LAB_00128686;
  }
  uVar18 = uVar22;
  if (pjVar17->iOp == 3) {
    if (uVar22 < uVar14) {
      __n = 0;
      lVar8 = 0;
      iVar10 = 0;
      do {
        if (*(long *)((long)ppjVar24 + __n) != 0) {
          uVar7 = *(uint *)(*(long *)(*(long *)((long)ppjVar24 + __n) + 0x18) + 0x10);
          if ((uVar7 >> 9 & 1) == 0) {
            if ((uVar7 >> 10 & 1) != 0) {
              if (iVar10 < 2) goto LAB_001288f1;
              iVar10 = iVar10 + -1;
            }
          }
          else {
            iVar10 = iVar10 + 1;
          }
        }
        lVar8 = lVar8 + -1;
        __n = __n + 8;
        if (-lVar8 == uVar5) break;
      } while( true );
    }
    sVar11 = pjVar16->pStart->nLine;
    pcVar9 = "Missing right parenthesis \')\'";
    goto LAB_00128d37;
  }
  do {
    uVar12 = uVar18 + 1;
    if (uVar14 <= uVar12) goto LAB_00128d4a;
    lVar8 = uVar18 + 1;
    uVar18 = uVar12;
  } while (apNode[lVar8] == (jx9_expr_node *)0x0);
  if (((int)uVar12 < nToken) && (-1 < iVar20)) {
    uVar12 = uVar12 & 0xffffffff;
    pjVar4 = apNode[uVar12];
    if ((pjVar4 != (jx9_expr_node *)0x0) &&
       (((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0)) &&
        (pjVar4 = apNode[uVar21], pjVar4 != (jx9_expr_node *)0x0)))) {
      if (pjVar4->pOp == (jx9_expr_op *)0x0) {
        pjVar16->pLeft = pjVar4;
        if (pjVar4->xCode != jx9CompileVariable) {
          sVar11 = pjVar16->pStart->nLine;
          pcVar9 = "\'%z\': Expecting a variable as left operand";
          goto LAB_00128d5d;
        }
      }
      else {
        if (pjVar4->pLeft == (jx9_expr_node *)0x0) goto LAB_00128d4a;
        pjVar16->pLeft = pjVar4;
      }
      pjVar16->pRight = apNode[uVar12];
      apNode[uVar12] = (jx9_expr_node *)0x0;
      apNode[uVar21] = (jx9_expr_node *)0x0;
      goto LAB_00128686;
    }
  }
LAB_00128d4a:
  sVar11 = pjVar16->pStart->nLine;
  pcVar9 = "\'%z\': Missing/Invalid member name";
  goto LAB_00128d5d;
LAB_001288f1:
  if (((iVar20 < 0) || (pjVar4 = apNode[uVar21], pjVar4 == (jx9_expr_node *)0x0)) ||
     ((pjVar4->pOp != (jx9_expr_op *)0x0 && (pjVar4->pLeft == (jx9_expr_node *)0x0)))) {
    sVar11 = pjVar16->pStart->nLine;
    pcVar9 = "Invalid function name";
LAB_00128d37:
    iVar20 = jx9GenCompileError(pGen,1,sVar11,pcVar9);
    goto LAB_00128d69;
  }
  if ((ulong)-lVar8 < 2) {
    pjVar16->pLeft = pjVar4;
    apNode[uVar21] = (jx9_expr_node *)0x0;
    if (lVar8 == 0) goto LAB_0012898b;
  }
  else {
    sVar2 = ExprProcessFuncArguments(pGen,pjVar16,apNode + uVar22 + 1,~(uint)lVar8);
    if (sVar2 != 0) {
      return sVar2;
    }
    pjVar16->pLeft = apNode[uVar21];
    apNode[uVar21] = (jx9_expr_node *)0x0;
  }
  memset(apNode + uVar22 + 1,0,__n);
LAB_0012898b:
  uVar21 = uVar22 & 0xffffffff;
LAB_00128689:
  uVar22 = uVar22 + 1;
  uVar15 = uVar15 + 1;
  uVar5 = (ulong)((int)uVar5 - 1);
  ppjVar24 = ppjVar24 + 1;
  if (uVar22 == uVar14) goto LAB_001289a4;
  goto LAB_00128667;
LAB_001289a4:
  uVar7 = 0xffffffff;
  uVar5 = 0;
  do {
    pjVar16 = apNode[uVar5];
    if (pjVar16 != (jx9_expr_node *)0x0) {
      if (((pjVar16->pOp != (jx9_expr_op *)0x0) && (pjVar16->pOp->iPrec == 3)) &&
         ((pjVar16->pLeft == (jx9_expr_node *)0x0 && (-1 < (int)uVar7)))) {
        pjVar4 = apNode[uVar7];
        if (((pjVar4->pOp != (jx9_expr_op *)0x0) && (pjVar4->pOp->iPrec == 2)) ||
           (pjVar4->xCode == jx9CompileVariable)) {
          pjVar16->pLeft = pjVar4;
          apNode[uVar7] = (jx9_expr_node *)0x0;
        }
      }
      uVar7 = (uint)uVar5;
    }
    uVar5 = uVar5 + 1;
  } while (uVar14 != uVar5);
  uVar21 = (ulong)(nToken - 1);
  uVar7 = 0xffffffff;
  uVar5 = uVar21;
  do {
    pjVar16 = apNode[uVar5];
    uVar3 = (uint)uVar5;
    uVar23 = uVar7;
    if ((((pjVar16 != (jx9_expr_node *)0x0) &&
         (pjVar17 = pjVar16->pOp, uVar23 = uVar3, pjVar17 != (jx9_expr_op *)0x0)) &&
        (pjVar17->iPrec == 3)) && (pjVar16->pLeft == (jx9_expr_node *)0x0)) {
      if (-1 < (int)uVar7) {
        pjVar4 = apNode[uVar7];
        if (pjVar4->pOp == (jx9_expr_op *)0x0) {
          if (pjVar4->xCode == jx9CompileVariable) goto LAB_00128a63;
        }
        else if (pjVar4->pOp->iPrec == 2) {
LAB_00128a63:
          pjVar16->pLeft = pjVar4;
          apNode[uVar7] = (jx9_expr_node *)0x0;
          *(byte *)&pjVar16->iFlags = (byte)pjVar16->iFlags | 1;
          goto LAB_00128a77;
        }
      }
      sVar11 = pjVar16->pStart->nLine;
      pcVar9 = "\'%z\' operator needs l-value";
      goto LAB_00128d5d;
    }
LAB_00128a77:
    uVar7 = uVar23;
    uVar5 = uVar5 - 1;
  } while (0 < (int)uVar3);
  uVar7 = 0;
  uVar5 = uVar21;
  do {
    pjVar16 = apNode[uVar5];
    uVar3 = (uint)uVar5;
    uVar23 = uVar7;
    if (((pjVar16 != (jx9_expr_node *)0x0) &&
        (pjVar17 = pjVar16->pOp, uVar23 = uVar3, pjVar17 != (jx9_expr_op *)0x0)) &&
       ((pjVar17->iPrec == 4 && (pjVar16->pLeft == (jx9_expr_node *)0x0)))) {
      if ((int)uVar7 < 1) {
        pSVar6 = pjVar16->pStart;
      }
      else {
        pjVar16->pLeft = apNode[uVar7];
        apNode[uVar7] = (jx9_expr_node *)0x0;
        pjVar16 = pjVar16->pLeft;
        if (((pjVar16 == (jx9_expr_node *)0x0) ||
            (pjVar17 = pjVar16->pOp, pjVar17 == (jx9_expr_op *)0x0)) ||
           ((pjVar17->iPrec < 5 ||
            ((pjVar16->pLeft != (jx9_expr_node *)0x0 && (pjVar16->pRight != (jx9_expr_node *)0x0))))
           )) goto LAB_00128aaa;
        pSVar6 = pjVar16->pStart;
      }
      sVar11 = pSVar6->nLine;
      pcVar9 = "\'%z\': Missing operand";
      goto LAB_00128d5d;
    }
LAB_00128aaa:
    uVar7 = uVar23;
    uVar5 = uVar5 - 1;
  } while (0 < (int)uVar3);
  iVar20 = 7;
  do {
    uVar15 = 0xffffffff;
    uVar5 = 0;
    do {
      pjVar16 = apNode[uVar5];
      if (pjVar16 != (jx9_expr_node *)0x0) {
        pjVar17 = pjVar16->pOp;
        if (((pjVar17 != (jx9_expr_op *)0x0) && (pjVar17->iPrec == iVar20)) &&
           (uVar22 = uVar5, pjVar16->pLeft == (jx9_expr_node *)0x0)) {
          do {
            uVar18 = uVar22 + 1;
            if (uVar14 <= uVar18) goto LAB_00128d16;
            lVar8 = uVar22 + 1;
            uVar22 = uVar18;
          } while (apNode[lVar8] == (jx9_expr_node *)0x0);
          if (((int)uVar18 < nToken) && (-1 < (int)uVar15)) {
            uVar18 = uVar18 & 0xffffffff;
            pjVar4 = apNode[uVar18];
            if ((((pjVar4 != (jx9_expr_node *)0x0) &&
                 ((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0))))
                && (pjVar4 = apNode[uVar15], pjVar4 != (jx9_expr_node *)0x0)) &&
               ((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0)))) {
              pjVar16->pLeft = pjVar4;
              pjVar16->pRight = apNode[uVar18];
              apNode[uVar18] = (jx9_expr_node *)0x0;
              apNode[uVar15] = (jx9_expr_node *)0x0;
              uVar15 = uVar5 & 0xffffffff;
              goto LAB_00128b2a;
            }
          }
LAB_00128d16:
          pSVar6 = pjVar16->pStart;
          goto LAB_00128d1a;
        }
        uVar15 = uVar5 & 0xffffffff;
      }
LAB_00128b2a:
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar14);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 0x11);
  uVar15 = 0xffffffff;
  uVar5 = 1;
  do {
    pjVar16 = apNode[uVar5 - 1];
    if (pjVar16 != (jx9_expr_node *)0x0) {
      pjVar17 = pjVar16->pOp;
      if (((pjVar17 != (jx9_expr_op *)0x0) && (pjVar17->iOp == 0x26)) &&
         (pjVar16->pLeft == (jx9_expr_node *)0x0)) {
        if ((((int)uVar15 < 0) || (pjVar4 = apNode[uVar15], pjVar4 == (jx9_expr_node *)0x0)) ||
           ((pjVar4->pOp != (jx9_expr_op *)0x0 && (pjVar4->pLeft == (jx9_expr_node *)0x0)))) {
          sVar11 = pjVar16->pStart->nLine;
          pcVar9 = "\'%z\': Syntax error";
          goto LAB_00128d5d;
        }
        uVar7 = (uint)uVar5;
        if (nToken <= (int)uVar7) goto LAB_0012903a;
        iVar20 = 1;
        uVar22 = uVar5;
        goto LAB_00128f3d;
      }
      uVar15 = uVar5 - 1 & 0xffffffff;
    }
    bVar25 = uVar5 != uVar14;
    uVar5 = uVar5 + 1;
  } while (bVar25);
LAB_00128c1a:
  uVar5 = 0xffffffff;
  do {
    pjVar16 = apNode[uVar21];
    uVar15 = uVar5;
    if (pjVar16 != (jx9_expr_node *)0x0) {
      pjVar17 = pjVar16->pOp;
      uVar15 = uVar21 & 0xffffffff;
      if (((pjVar17 != (jx9_expr_op *)0x0) && (pjVar17->iPrec == 0x12)) &&
         (uVar22 = uVar21, pjVar16->pLeft == (jx9_expr_node *)0x0)) {
        do {
          uVar18 = uVar22 - 1;
          if (uVar22 == 0) goto LAB_00128dbd;
          uVar22 = uVar18;
        } while (apNode[uVar18] == (jx9_expr_node *)0x0);
        if (((-1 < (int)uVar5) && (pjVar4 = apNode[uVar5], pjVar4 != (jx9_expr_node *)0x0)) &&
           ((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0)))) {
          uVar18 = uVar18 & 0xffffffff;
          pjVar19 = apNode[uVar18];
          if (pjVar19 != (jx9_expr_node *)0x0) {
            ppjVar1 = &pjVar19->pOp;
            if (*ppjVar1 == (jx9_expr_op *)0x0) {
LAB_00128ce1:
              if (pjVar19->xCode != jx9CompileVariable) goto LAB_00128ce7;
            }
            else {
              pjVar19 = pjVar19->pLeft;
              if (pjVar19 == (jx9_expr_node *)0x0) goto LAB_00128dbd;
              iVar20 = (*ppjVar1)->iOp;
              if (iVar20 != 0) {
                if (iVar20 == 2) {
                  if (pjVar19->pOp == (jx9_expr_op *)0x0) goto LAB_00128ce1;
                  if ((pjVar19->pOp->iOp & 0xfffffffdU) == 0) goto LAB_00128cf2;
                }
LAB_00128ce7:
                if (pjVar17->iVmOp != 0x2a) {
                  sVar11 = pjVar16->pStart->nLine;
                  pcVar9 = "\'%z\': Left operand must be a modifiable l-value";
                  goto LAB_00128d5d;
                }
              }
            }
LAB_00128cf2:
            pjVar16->pLeft = pjVar4;
            pjVar16->pRight = apNode[uVar18];
            apNode[uVar5] = (jx9_expr_node *)0x0;
            apNode[uVar18] = (jx9_expr_node *)0x0;
            goto LAB_00128c48;
          }
        }
LAB_00128dbd:
        pSVar6 = pjVar16->pStart;
        goto LAB_00128d1a;
      }
    }
LAB_00128c48:
    iVar20 = (int)uVar21;
    uVar21 = uVar21 - 1;
    uVar5 = uVar15;
  } while (0 < iVar20);
  uVar7 = 0xffffffff;
  uVar5 = 0;
  do {
    pjVar16 = apNode[uVar5];
    if (pjVar16 != (jx9_expr_node *)0x0) {
      pjVar17 = pjVar16->pOp;
      if (((pjVar17 != (jx9_expr_op *)0x0) && (pjVar17->iPrec == 0x16)) &&
         (uVar21 = uVar5, pjVar16->pLeft == (jx9_expr_node *)0x0)) {
        do {
          uVar15 = uVar21 + 1;
          if (uVar14 <= uVar15) goto LAB_00128ef5;
          lVar8 = uVar21 + 1;
          uVar21 = uVar15;
        } while (apNode[lVar8] == (jx9_expr_node *)0x0);
        if (((int)uVar15 < nToken) && (-1 < (int)uVar7)) {
          uVar15 = uVar15 & 0xffffffff;
          pjVar4 = apNode[uVar15];
          if ((pjVar4 != (jx9_expr_node *)0x0) &&
             ((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0)))) {
            pjVar4 = apNode[uVar7];
            if ((pjVar4 != (jx9_expr_node *)0x0) &&
               ((pjVar4->pOp == (jx9_expr_op *)0x0 || (pjVar4->pLeft != (jx9_expr_node *)0x0)))) {
              pjVar16->pLeft = pjVar4;
              pjVar16->pRight = apNode[uVar15];
              apNode[uVar15] = (jx9_expr_node *)0x0;
              apNode[uVar7] = (jx9_expr_node *)0x0;
              goto LAB_00128e7e;
            }
          }
        }
LAB_00128ef5:
        pSVar6 = pjVar16->pStart;
LAB_00128d1a:
        sVar11 = pSVar6->nLine;
        pcVar9 = "\'%z\': Missing/Invalid operand";
        goto LAB_00128d5d;
      }
LAB_00128e7e:
      uVar7 = (uint)uVar5;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != uVar14);
  if (nToken != 1) {
    uVar5 = 2;
    if (2 < nToken) {
      uVar5 = uVar14;
    }
    uVar14 = 1;
    do {
      pjVar16 = apNode[uVar14];
      if (pjVar16 != (jx9_expr_node *)0x0) {
        if (((pjVar16->pOp != (jx9_expr_op *)0x0) || (pjVar16->xCode != (ProcNodeConstruct)0x0)) &&
           (*apNode != (jx9_expr_node *)0x0)) {
          pjVar17 = (jx9_expr_op *)pjVar16->pStart;
          sVar11 = pjVar17->iPrec;
          pcVar9 = "Unexpected token \'%z\'";
          goto LAB_00128d5d;
        }
        *apNode = pjVar16;
        apNode[uVar14] = (jx9_expr_node *)0x0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  return 0;
LAB_00128f3d:
  do {
    pjVar4 = apNode[uVar22];
    if (pjVar4 != (jx9_expr_node *)0x0) {
      if (((pjVar4->pOp == (jx9_expr_op *)0x0) || (pjVar4->pOp->iOp != 0x26)) ||
         (pjVar4->pCond != (jx9_expr_node *)0x0)) {
        if ((pjVar4->pStart->nType & 0x100000) != 0) {
          uVar18 = uVar22;
          if (iVar20 < 2) break;
          iVar20 = iVar20 + -1;
        }
      }
      else {
        iVar20 = iVar20 + 1;
      }
    }
    uVar22 = uVar22 + 1;
    uVar18 = uVar14;
  } while (uVar14 != uVar22);
  uVar23 = (uint)uVar18;
  if (uVar7 < uVar23) {
    ppjVar24 = apNode + (uVar5 & 0xffffffff);
    sVar2 = ExprMakeTree(pGen,ppjVar24,uVar23 - uVar7);
    if (sVar2 != 0) {
      return sVar2;
    }
    pjVar16->pLeft = *ppjVar24;
    *ppjVar24 = (jx9_expr_node *)0x0;
    if ((int)(uVar23 + 1) < nToken) {
      ppjVar24 = apNode + (uVar23 + 1);
      sVar2 = ExprMakeTree(pGen,ppjVar24,~uVar23 + nToken);
      if (sVar2 != 0) {
        return sVar2;
      }
      pjVar16->pRight = *ppjVar24;
      apNode[uVar18 & 0xffffffff] = (jx9_expr_node *)0x0;
      *ppjVar24 = (jx9_expr_node *)0x0;
      pjVar16->pCond = apNode[uVar15];
      apNode[uVar15] = (jx9_expr_node *)0x0;
      goto LAB_00128c1a;
    }
    pjVar17 = pjVar16->pOp;
    sVar11 = pjVar16->pStart->nLine;
    pcVar9 = "\'%z\': Missing \'else\' expression";
  }
  else {
LAB_0012903a:
    sVar11 = pjVar16->pStart->nLine;
    pcVar9 = "\'%z\': Missing \'then\' expression";
  }
LAB_00128d5d:
  iVar20 = jx9GenCompileError(pGen,1,sVar11,pcVar9,pjVar17);
LAB_00128d69:
  return (uint)(iVar20 == -10) * 2 | 0xfffffff4;
}

Assistant:

static sxi32 ExprMakeTree(jx9_gen_state *pGen, jx9_expr_node **apNode, sxi32 nToken)
 {
	 sxi32 i, iLeft, iRight;
	 jx9_expr_node *pNode;
	 sxi32 iCur;
	 sxi32 rc;
	 if( nToken <= 0 || (nToken == 1 && apNode[0]->xCode) ){
		 /* TICKET 1433-17: self evaluating node */
		 return SXRET_OK;
	 }
	 /* Process expressions enclosed in parenthesis first */
	 for( iCur =  0 ; iCur < nToken ; ++iCur ){
		 sxi32 iNest;
		 /* Note that, we use strict comparison here '!=' instead of the bitwise and '&' operator
		  * since the LPAREN token can also be an operator [i.e: Function call].
		  */
		 if( apNode[iCur] == 0 || apNode[iCur]->pStart->nType != JX9_TK_LPAREN ){
			 continue;
		 }
		 iNest = 1;
		 iLeft = iCur;
		 /* Find the closing parenthesis */
		 iCur++;
		 while( iCur < nToken ){
			 if( apNode[iCur] ){
				 if( apNode[iCur]->pStart->nType & JX9_TK_RPAREN /* ')' */){
					 /* Decrement nesting level */
					 iNest--;
					 if( iNest <= 0 ){
						 break;
					 }
				 }else if( apNode[iCur]->pStart->nType & JX9_TK_LPAREN /* '(' */ ){
					 /* Increment nesting level */
					 iNest++;
				 }
			 }
			 iCur++;
		 }
		 if( iCur - iLeft > 1 ){
			 /* Recurse and process this expression */
			 rc = ExprMakeTree(&(*pGen), &apNode[iLeft + 1], iCur - iLeft - 1);
			 if( rc != SXRET_OK ){
				 return rc;
			 }
		 }
		 /* Free the left and right nodes */
		 ExprFreeTree(&(*pGen), apNode[iLeft]);
		 ExprFreeTree(&(*pGen), apNode[iCur]);
		 apNode[iLeft] = 0;
		 apNode[iCur] = 0;
	 }
	 /* Handle postfix [i.e: function call, member access] operators with precedence 2 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 2 && pNode->pLeft == 0  ){
			 if( pNode->pOp->iOp == EXPR_OP_FUNC_CALL ){
				 /* Collect function arguments */
				 sxi32 iPtr = 0;
				 sxi32 nFuncTok = 0;
				 while( nFuncTok + iCur < nToken ){
					 if( apNode[nFuncTok+iCur] ){
						 if( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_LPAREN /*'('*/ ){
							 iPtr++;
						 }else if ( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_RPAREN /*')'*/){
							 iPtr--;
							 if( iPtr <= 0 ){
								 break;
							 }
						 }
					 }
					 nFuncTok++;
				 }
				 if( nFuncTok + iCur >= nToken ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Missing right parenthesis ')'");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 if(  iLeft < 0 || !NODE_ISTERM(iLeft) /*|| ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2)*/ ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Invalid function name");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 if( nFuncTok > 1 ){
					 /* Process function arguments */
					 rc = ExprProcessFuncArguments(&(*pGen), pNode, &apNode[iCur+1], nFuncTok-1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 apNode[iLeft] = 0;
				 for( iPtr = 1; iPtr <= nFuncTok ; iPtr++ ){
					 apNode[iCur+iPtr] = 0;
				 }
			 }else if (pNode->pOp->iOp == EXPR_OP_SUBSCRIPT ){
				 /* Subscripting */
				 sxi32 iArrTok = iCur + 1;
				 sxi32 iNest = 1;
				 if(  iLeft >= 0 && (apNode[iLeft]->xCode == jx9CompileVariable || (apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* postfix */) ) ){
					 /* Collect index tokens */
				    while( iArrTok < nToken ){
					 if( apNode[iArrTok] ){
						 if( apNode[iArrTok]->pStart->nType & JX9_TK_OSB /*'['*/){
							 /* Increment nesting level */
							 iNest++;
						 }else if( apNode[iArrTok]->pStart->nType & JX9_TK_CSB /*']'*/){
							 /* Decrement nesting level */
							 iNest--;
							 if( iNest <= 0 ){
								 break;
							 }
						 }
					 }
					 ++iArrTok;
				   }
				   if( iArrTok > iCur + 1 ){
					 /* Recurse and process this expression */
					 rc = ExprMakeTree(&(*pGen), &apNode[iCur+1], iArrTok - iCur - 1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
					 /* Link the node to it's index */
					 SySetPut(&pNode->aNodeArgs, (const void *)&apNode[iCur+1]);
				   }
				   /* Link the node to the tree */
				   pNode->pLeft = apNode[iLeft];
				   pNode->pRight = 0;
				   apNode[iLeft] = 0;
				   for( iNest = iCur + 1 ; iNest <= iArrTok ; ++iNest ){
					 apNode[iNest] = 0;
				  }
				 }
			 }else{
				 /* Member access operators [i.e: '.' ] */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid member name", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 if( pNode->pLeft->pOp == 0 && pNode->pLeft->xCode != jx9CompileVariable ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Expecting a variable as left operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
		 }
		 iLeft = iCur;
	 }
	  /* Handle post/pre icrement/decrement [i.e: ++/--] operators with precedence 3 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft >= 0 && ((apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* Postfix */)
				 || apNode[iLeft]->xCode == jx9CompileVariable) ){
					 /* Link the node to the tree */
					 pNode->pLeft = apNode[iLeft];
					 apNode[iLeft] = 0; 
			 }
		  }
		 iLeft = iCur;
	  }
	 iLeft = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft < 0 || (apNode[iLeft]->pOp == 0 && apNode[iLeft]->xCode != jx9CompileVariable)
				 || ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2 /* Postfix */) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z' operator needs l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 apNode[iLeft] = 0;
			 /* Mark as pre-increment/decrement node */
			 pNode->iFlags |= EXPR_NODE_PRE_INCR;
		  }
		 iLeft = iCur;
	 }
	 /* Handle right associative unary and cast operators [i.e: !, (string), ~...]  with precedence 4 */
	  iLeft = 0;
	  for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		  if( apNode[iCur] ){
			  pNode = apNode[iCur];
			  if( pNode->pOp && pNode->pOp->iPrec == 4 && pNode->pLeft == 0){
				  if( iLeft > 0 ){
					  /* Link the node to the tree */
					  pNode->pLeft = apNode[iLeft];
					  apNode[iLeft] = 0;
					  if( pNode->pLeft && pNode->pLeft->pOp && pNode->pLeft->pOp->iPrec > 4 ){
						  if( pNode->pLeft->pLeft == 0 || pNode->pLeft->pRight == 0 ){
							   /* Syntax error */
							  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pLeft->pStart->nLine, "'%z': Missing operand", &pNode->pLeft->pOp->sOp);
							  if( rc != SXERR_ABORT ){
								  rc = SXERR_SYNTAX;
							  }
							  return rc;
						  }
					  }
				  }else{
					  /* Syntax error */
					  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing operand", &pNode->pOp->sOp);
					  if( rc != SXERR_ABORT ){
						  rc = SXERR_SYNTAX;
					  }
					  return rc;
				  }
			  }
			  /* Save terminal position */
			  iLeft = iCur;
		  }
	  }	 
	 /* Process left and non-associative binary operators [i.e: *, /, &&, ||...]*/
	 for( i = 7 ; i < 17 ; i++ ){
		 iLeft = -1;
		 for( iCur = 0 ; iCur < nToken ; ++iCur ){
			 if( apNode[iCur] == 0 ){
				 continue;
			 }
			 pNode = apNode[iCur];
			 if( pNode->pOp && pNode->pOp->iPrec == i && pNode->pLeft == 0 ){
				 /* Get the right node */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
			 iLeft = iCur;
		 }
	 }
	 /* Handle the ternary operator. (expr1) ? (expr2) : (expr3) 
	  * Note that we do not need a precedence loop here since
	  * we are dealing with a single operator.
	  */
	  iLeft = -1;
	  for( iCur = 0 ; iCur < nToken ; ++iCur ){
		  if( apNode[iCur] == 0 ){
			  continue;
		  }
		  pNode = apNode[iCur];
		  if( pNode->pOp && pNode->pOp->iOp == EXPR_OP_QUESTY && pNode->pLeft == 0 ){
			  sxi32 iNest = 1;
			  if( iLeft < 0 || !NODE_ISTERM(iLeft) ){
				  /* Missing condition */
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Syntax error", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;
			  }
			  /* Get the right node */
			  iRight = iCur + 1;
			  while( iRight < nToken  ){
				  if( apNode[iRight] ){
					  if( apNode[iRight]->pOp && apNode[iRight]->pOp->iOp == EXPR_OP_QUESTY && apNode[iRight]->pCond == 0){
						  /* Increment nesting level */
						  ++iNest;
					  }else if( apNode[iRight]->pStart->nType & JX9_TK_COLON /*:*/ ){
						  /* Decrement nesting level */
						  --iNest;
						  if( iNest <= 0 ){
							  break;
						  }
					  }
				  }
				  iRight++;
			  }
			  if( iRight > iCur + 1 ){
				  /* Recurse and process the then expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iCur + 1], iRight - iCur - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pLeft = apNode[iCur + 1];
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'then' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  apNode[iCur + 1] = 0;
			  if( iRight + 1 < nToken ){
				  /* Recurse and process the else expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iRight + 1], nToken - iRight - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pRight = apNode[iRight + 1];
				  apNode[iRight + 1] =  apNode[iRight] = 0;
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'else' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  /* Point to the condition */
			  pNode->pCond  = apNode[iLeft];
			  apNode[iLeft] = 0;
			  break;
		  }
		  iLeft = iCur;
	  }
	 /* Process right associative binary operators [i.e: '=', '+=', '/='] 
	  * Note: All right associative binary operators have precedence 18
	  * so there is no need for a precedence loop here.
	  */
	 iRight = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur--){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 18 && pNode->pLeft == 0 ){
			 /* Get the left node */
			 iLeft = iCur - 1;
			 while( iLeft >= 0 && apNode[iLeft] == 0 ){
				 iLeft--;
			 }
			 if( iLeft < 0 || iRight < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 if( ExprIsModifiableValue(apNode[iLeft]) == FALSE ){
				 if( pNode->pOp->iVmOp != JX9_OP_STORE  ){
					 /* Left operand must be a modifiable l-value */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Left operand must be a modifiable l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
			 }
			 /* Link the node to the tree (Reverse) */
			 pNode->pLeft = apNode[iRight];
			 pNode->pRight = apNode[iLeft];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iRight = iCur;
	 }
	 /* Process the lowest precedence operator (22, comma) */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 22 /* ',' */ && pNode->pLeft == 0 ){
			 /* Get the right node */
			 iRight = iCur + 1;
			 while( iRight < nToken && apNode[iRight] == 0 ){
				 iRight++;
			 }
			 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 pNode->pRight = apNode[iRight];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iLeft = iCur;
	 }
	 /* Point to the root of the expression tree */
	 for( iCur = 1 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] ){
			 if( (apNode[iCur]->pOp || apNode[iCur]->xCode ) && apNode[0] != 0){
				 rc = jx9GenCompileError(pGen, E_ERROR, apNode[iCur]->pStart->nLine, "Unexpected token '%z'", &apNode[iCur]->pStart->sData);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;  
			 }
			 apNode[0] = apNode[iCur];
			 apNode[iCur] = 0;
		 }
	 }
	 return SXRET_OK;
 }